

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O1

void do_vicinity_map(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar2 = (int)u.uy;
  iVar4 = 5;
  if (5 < iVar2) {
    iVar4 = iVar2;
  }
  iVar5 = 0xf;
  if (iVar2 < 0xf) {
    iVar5 = iVar2;
  }
  iVar3 = (int)u.ux;
  iVar2 = 10;
  if (10 < iVar3) {
    iVar2 = iVar3;
  }
  iVar2 = iVar2 + -9;
  iVar6 = 0x46;
  if (iVar3 < 0x46) {
    iVar6 = iVar3;
  }
  if (iVar2 < iVar6 + 10) {
    do {
      iVar3 = iVar4 + -5;
      if (iVar4 + -5 < iVar5 + 6) {
        do {
          show_map_spot(iVar2,iVar3);
          iVar1 = iVar3 - iVar5;
          iVar3 = iVar3 + 1;
        } while (iVar1 != 5);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != iVar6 + 10);
  }
  if ((((level->flags).field_0x9 & 0x40) != 0) && ((u._1052_1_ & 2) == 0)) {
    return;
  }
  flush_screen();
  (*windowprocs.win_pause)(P_MAP);
  doredraw();
  return;
}

Assistant:

void do_vicinity_map(void)
{
    int zx, zy;
    int lo_y = (u.uy-5 < 0 ? 0 : u.uy-5),
	hi_y = (u.uy+6 > ROWNO ? ROWNO : u.uy+6),
	lo_x = (u.ux-9 < 1 ? 1 : u.ux-9),	/* avoid column 0 */
	hi_x = (u.ux+10 > COLNO ? COLNO : u.ux+10);

    for (zx = lo_x; zx < hi_x; zx++)
	for (zy = lo_y; zy < hi_y; zy++)
	    show_map_spot(zx, zy);

    if (!level->flags.hero_memory || Underwater) {
	flush_screen();			/* flush temp screen */
	win_pause_output(P_MAP);	/* wait */
	doredraw();
    }
}